

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_compilation_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  IProgramContextSupplier *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  LayoutBindingProgram *pLVar6;
  _func_int **pp_Var7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  allocator<char> local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  String local_330;
  LayoutBindingTestResult *local_310;
  string local_308 [32];
  String local_2e8;
  String local_2c8;
  String local_2a8;
  String local_288;
  String local_268;
  String local_248;
  String local_228;
  String local_208;
  String local_1e8;
  String decl;
  StringStream s;
  undefined4 extraout_var_00;
  
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  StringStream::StringStream(&s);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  poVar5 = std::operator<<((ostream *)&s,*(char **)(CONCAT44(extraout_var,iVar3) + 0x10));
  std::operator<<(poVar5,"(0.0);");
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,"UNIFORM_ACCESS",&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  StringStream::reset(&s);
  poVar5 = std::operator<<((ostream *)&s,"layout(binding=0) ");
  std::operator<<(poVar5,"uniform float tex0;");
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,"UNIFORM_DECL",&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  updateTemplate(this);
  pIVar1 = &this->super_IProgramContextSupplier;
  iVar3 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar6 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar3);
  bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
  if (bVar2) {
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_330,pLVar6,true);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    pp_Var7 = pLVar6->_vptr_LayoutBindingProgram;
LAB_00be73dd:
    (*pp_Var7[1])(pLVar6);
    StringStream::~StringStream(&s);
  }
  else {
    (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
    StringStream::~StringStream(&s);
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,*(char **)CONCAT44(extraout_var_01,iVar3),&local_333);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"0.0",&local_334);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
              (&local_288,this,&local_2a8);
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,*(char **)(CONCAT44(extraout_var_02,iVar3) + 0x18),&local_331);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_208,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_2e8,this,&local_208);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_308,this,0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"float",&local_332);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_228,this,local_308,&local_248);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_268,this,0);
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    buildUniformDecl((String *)&s,this,&local_330,&local_288,&local_2c8,&local_2e8,&local_228,
                     &local_268,&local_1e8);
    std::__cxx11::string::operator=((string *)&decl,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_330);
    setTemplateParam(this,"UNIFORM_DECL",&decl);
    updateTemplate(this);
    iVar3 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
    pLVar6 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar3);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
    if (bVar2) {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar6,true);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&s);
    }
    else {
      (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,*(char **)CONCAT44(extraout_var_04,iVar3),&local_333);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-1",&local_334);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
                (&local_288,this,&local_2a8);
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,*(char **)(CONCAT44(extraout_var_05,iVar3) + 0x18),&local_331)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_208,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_2e8,this,&local_208);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_308,this,0)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"float",&local_332);
      local_310 = __return_storage_ptr__;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_228,this,local_308,&local_248);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_268,this,0);
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      buildUniformDecl((String *)&s,this,&local_330,&local_288,&local_2c8,&local_2e8,&local_228,
                       &local_268,&local_1e8);
      std::__cxx11::string::operator=((string *)&decl,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_330);
      setTemplateParam(this,"UNIFORM_DECL",&decl);
      __return_storage_ptr__ = local_310;
      updateTemplate(this);
      iVar3 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
      pLVar6 = (LayoutBindingProgram *)CONCAT44(extraout_var_06,iVar3);
      bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
      if (bVar2) {
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar6,true);
        __return_storage_ptr__->m_passed = false;
        __return_storage_ptr__->m_notRunForThisContext = false;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&s);
      }
      else {
        (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
        iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,*(char **)CONCAT44(extraout_var_07,iVar3),
                   (allocator<char> *)&local_1e8);
        uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                  (&local_288,this,(ulong)uVar4);
        iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,*(char **)(CONCAT44(extraout_var_08,iVar3) + 0x18),
                   &local_333);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_2e8,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_2c8,this,&local_2e8);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_228,this,0);
        std::__cxx11::string::string<std::allocator<char>>(local_308,"float",&local_334);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                  (&local_208,this,&local_228,local_308);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_248,this,0);
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        buildUniformDecl((String *)&s,this,&local_330,&local_288,&local_2a8,&local_2c8,&local_208,
                         &local_248,&local_268);
        std::__cxx11::string::operator=((string *)&decl,(string *)&s);
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_330);
        setTemplateParam(this,"UNIFORM_DECL",&decl);
        __return_storage_ptr__ = local_310;
        updateTemplate(this);
        iVar3 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
        pLVar6 = (LayoutBindingProgram *)CONCAT44(extraout_var_09,iVar3);
        bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
        if (!bVar2) {
          (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,*(char **)CONCAT44(extraout_var_10,iVar3),
                     (allocator<char> *)&local_1e8);
          uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this)
          ;
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                    (&local_288,this,(ulong)uVar4);
          iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,*(char **)(CONCAT44(extraout_var_11,iVar3) + 0x18),
                     &local_333);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (&local_2e8,this,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                    (&local_2c8,this,&local_2e8);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (&local_228,this,0);
          std::__cxx11::string::string<std::allocator<char>>(local_308,"float",&local_334);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                    (&local_208,this,&local_228,local_308);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                    (&local_248,this,0);
          local_268._M_string_length = 0;
          local_268.field_2._M_local_buf[0] = '\0';
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          buildUniformDecl((String *)&s,this,&local_330,&local_288,&local_2a8,&local_2c8,&local_208,
                           &local_248,&local_268);
          std::__cxx11::string::operator=((string *)&decl,(string *)&s);
          std::__cxx11::string::~string((string *)&s);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string(local_308);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_330);
          setTemplateParam(this,"UNIFORM_DECL",&decl);
          __return_storage_ptr__ = local_310;
          StringStream::StringStream(&s);
          std::operator<<((ostream *)&s,"vec4(0.0);\n");
          std::__cxx11::stringbuf::str();
          setTemplateParam(this,"UNIFORM_ACCESS",&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          updateTemplate(this);
          iVar3 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
          pLVar6 = (LayoutBindingProgram *)CONCAT44(extraout_var_12,iVar3);
          bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar6);
          if (!bVar2) {
            (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
            StringStream::~StringStream(&s);
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream =
                 (_func_int **)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x10;
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
            s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
            LayoutBindingTestResult::LayoutBindingTestResult
                      (__return_storage_ptr__,true,(String *)&s,false);
            std::__cxx11::string::~string((string *)&s);
            goto LAB_00be7b3f;
          }
          LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_330,pLVar6,true);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          std::__cxx11::string::string
                    ((string *)&__return_storage_ptr__->m_reason,(string *)&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          pp_Var7 = pLVar6->_vptr_LayoutBindingProgram;
          goto LAB_00be73dd;
        }
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar6,true);
        __return_storage_ptr__->m_passed = false;
        __return_storage_ptr__->m_notRunForThisContext = false;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&s);
      }
    }
    std::__cxx11::string::~string((string *)&s);
    (*pLVar6->_vptr_LayoutBindingProgram[1])(pLVar6);
  }
LAB_00be7b3f:
  std::__cxx11::string::~string((string *)&decl);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_compilation_errors(void)
{
	bool   passed = true;
	String decl;

	// verify "uniform float var;" doesn't compile
	{
		StringStream s;
		s << getTestParameters().vector_type << "(0.0);";

		setTemplateParam("UNIFORM_ACCESS", s.str());
		s.reset();
		s << "layout(binding=0) "
		  << "uniform float tex0;";
		setTemplateParam("UNIFORM_DECL", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	// verify that non-constant integer expression in binding fails
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("0.0")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("-1")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		s << "vec4(0.0);\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	return LayoutBindingTestResult(passed, String());
}